

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

void picojson::serialize_str<std::ostream_iterator<char,char,std::char_traits<char>>>
               (string *s,ostream_iterator<char,_char,_std::char_traits<char>_> *oi)

{
  char cVar1;
  bool bVar2;
  ostream_iterator<char,_char,_std::char_traits<char>_> *poVar3;
  reference pcVar4;
  byte *pbVar5;
  char local_229;
  char local_228 [16];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_218;
  char local_207 [6];
  undefined1 auStack_201 [2];
  char buf [7];
  allocator<char> local_1e9;
  string local_1e8;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_1c8;
  allocator<char> local_1b1;
  string local_1b0;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_190;
  allocator<char> local_179;
  string local_178;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_158;
  allocator<char> local_141;
  string local_140;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_120;
  allocator<char> local_109;
  string local_108;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_e8;
  allocator<char> local_d1;
  string local_d0;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_b0;
  allocator<char> local_99;
  string local_98;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_78 [2];
  allocator<char> local_51;
  string local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  const_iterator i;
  ostream_iterator<char,_char,_std::char_traits<char>_> *oi_local;
  string *s_local;
  
  i._M_current._7_1_ = 0x22;
  poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(oi,0);
  poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(poVar3);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
            (poVar3,(char *)((long)&i._M_current + 7));
  local_28._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_30._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar2) break;
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    cVar1 = *pcVar4;
    if (cVar1 == '\b') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"\\b",&local_109);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_120,oi);
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_108,&local_120);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
    }
    else if (cVar1 == '\t') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"\\t",&local_1e9);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
                ((ostream_iterator<char,_char,_std::char_traits<char>_> *)(auStack_201 + 1),oi);
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>
                (&local_1e8,
                 (ostream_iterator<char,_char,_std::char_traits<char>_> *)(auStack_201 + 1));
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
    }
    else if (cVar1 == '\n') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"\\n",&local_179);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_190,oi);
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_178,&local_190);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
    }
    else if (cVar1 == '\f') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"\\f",&local_141);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_158,oi);
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_140,&local_158);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    else if (cVar1 == '\r') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"\\r",&local_1b1);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_1c8,oi);
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_1b0,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
    }
    else if (cVar1 == '\"') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\\\"",&local_51);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(local_78,oi);
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_50,local_78);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    else if (cVar1 == '/') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"\\/",&local_d1);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_e8,oi);
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_d0,&local_e8);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
    }
    else if (cVar1 == '\\') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"\\\\",&local_99);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_b0,oi);
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_98,&local_b0);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    }
    else {
      pbVar5 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_28);
      if ((*pbVar5 < 0x20) ||
         (pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_28), *pcVar4 == '\x7f')) {
        pbVar5 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_28);
        snprintf(local_207,7,"\\u%04x",(ulong)*pbVar5);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_218,oi);
        std::copy<char*,std::ostream_iterator<char,char,std::char_traits<char>>>
                  (local_228,local_207,
                   (ostream_iterator<char,_char,_std::char_traits<char>_> *)auStack_201);
      }
      else {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_28);
        poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(oi,0);
        poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(poVar3);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(poVar3,pcVar4);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  local_229 = '\"';
  poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(oi,0);
  poVar3 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(poVar3);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(poVar3,&local_229);
  return;
}

Assistant:

void serialize_str(const std::string& s, Iter oi) {
    *oi++ = '"';
    for (std::string::const_iterator i = s.begin(); i != s.end(); ++i) {
      switch (*i) {
#define MAP(val, sym) case val: copy(sym, oi); break
	MAP('"', "\\\"");
	MAP('\\', "\\\\");
	MAP('/', "\\/");
	MAP('\b', "\\b");
	MAP('\f', "\\f");
	MAP('\n', "\\n");
	MAP('\r', "\\r");
	MAP('\t', "\\t");
#undef MAP
      default:
	if ((unsigned char)*i < 0x20 || *i == 0x7f) {
	  char buf[7];
	  SNPRINTF(buf, sizeof(buf), "\\u%04x", *i & 0xff);
	  copy(buf, buf + 6, oi);
	  } else {
	  *oi++ = *i;
	}
	break;
      }
    }
    *oi++ = '"';
  }